

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printCsvResult(Statement *query,ostream *stream,bool isFirstRow,bool clip)

{
  int32_t iVar1;
  char *pcVar2;
  ostream *poVar3;
  double dVar4;
  Column CStack_a8;
  double local_90;
  double local_88;
  Column local_80;
  Column local_68;
  Column local_50;
  Column local_38;
  
  SQLite::Statement::getColumn(&CStack_a8,query,0);
  pcVar2 = SQLite::Column::getText(&CStack_a8,"");
  poVar3 = std::operator<<(stream,pcVar2);
  std::operator<<(poVar3,",");
  SQLite::Statement::getColumn(&local_80,query,1);
  dVar4 = SQLite::Column::getDouble(&local_80);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar3,",");
  SQLite::Statement::getColumn(&local_38,query,2);
  dVar4 = SQLite::Column::getDouble(&local_38);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar3,",");
  SQLite::Statement::getColumn(&local_50,query,3);
  dVar4 = SQLite::Column::getDouble(&local_50);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar3,",");
  SQLite::Statement::getColumn(&local_68,query,4);
  dVar4 = SQLite::Column::getDouble(&local_68);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar3,",");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&CStack_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (clip) {
    SQLite::Statement::getColumn(&CStack_a8,query,5);
    local_88 = SQLite::Column::getDouble(&CStack_a8);
    SQLite::Statement::getColumn(&local_80,query,1);
    local_90 = SQLite::Column::getDouble(&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&CStack_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_88 <= local_90) {
      SQLite::Statement::getColumn(&CStack_a8,query,5);
      iVar1 = SQLite::Column::getInt(&CStack_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&CStack_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (iVar1 != 0) goto LAB_00118b18;
      std::operator<<(stream,"NaN,");
    }
    else {
      SQLite::Statement::getColumn(&CStack_a8,query,1);
      dVar4 = SQLite::Column::getDouble(&CStack_a8);
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::operator<<(poVar3,",");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&CStack_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
LAB_00118b6b:
    SQLite::Statement::getColumn(&CStack_a8,query,6);
    local_88 = SQLite::Column::getDouble(&CStack_a8);
    SQLite::Statement::getColumn(&local_80,query,3);
    local_90 = SQLite::Column::getDouble(&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&CStack_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_90 < local_88) {
      SQLite::Statement::getColumn(&CStack_a8,query,3);
      dVar4 = SQLite::Column::getDouble(&CStack_a8);
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_00118c49;
    }
    SQLite::Statement::getColumn(&CStack_a8,query,6);
    iVar1 = SQLite::Column::getInt(&CStack_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&CStack_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (iVar1 == 0) {
      poVar3 = std::operator<<(stream,"NaN");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
  }
  else {
LAB_00118b18:
    SQLite::Statement::getColumn(&CStack_a8,query,5);
    dVar4 = SQLite::Column::getDouble(&CStack_a8);
    poVar3 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar3,",");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&CStack_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (clip) goto LAB_00118b6b;
  }
  SQLite::Statement::getColumn(&CStack_a8,query,6);
  dVar4 = SQLite::Column::getDouble(&CStack_a8);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00118c49:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&CStack_a8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void printCsvResult(SQLite::Statement& query, std::ostream& stream, bool isFirstRow, bool clip)
{
    stream << query.getColumn(0).getText()   << ","
           << query.getColumn(1).getDouble() << ","
           << query.getColumn(2).getDouble() << ","
           << query.getColumn(3).getDouble() << ","
           << query.getColumn(4).getDouble() << ",";

    if (clip && query.getColumn(5).getDouble() > query.getColumn(1).getDouble())
    {
        stream << query.getColumn(1).getDouble() << ",";
    }
    else if (clip && query.getColumn(5).getInt() == 0)
    {
        stream << "NaN,";
    }
    else
    {
        stream << query.getColumn(5).getDouble() << ",";
    }

    if (clip && query.getColumn(6).getDouble() > query.getColumn(3).getDouble())
    {
        stream << query.getColumn(3).getDouble() << std::endl;
    }
    else if (clip && query.getColumn(6).getInt() == 0)
    {
        stream << "NaN" << std::endl;
    }
    else
    {
        stream << query.getColumn(6).getDouble() << std::endl;
    }
}